

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

void __thiscall
leveldb::DBImpl::GetApproximateSizes(DBImpl *this,Range *range,int n,uint64_t *sizes)

{
  Version *this_00;
  uint64_t uVar1;
  uint64_t uVar2;
  long local_c0;
  uint64_t limit;
  uint64_t start;
  InternalKey k2;
  InternalKey k1;
  int i;
  Version *v;
  MutexLock l;
  uint64_t *sizes_local;
  int n_local;
  Range *range_local;
  DBImpl *this_local;
  
  l.mu_ = (Mutex *)sizes;
  MutexLock::MutexLock((MutexLock *)&v,&this->mutex_);
  this_00 = VersionSet::current(this->versions_);
  Version::Ref(this_00);
  for (k1._24_4_ = 0; (int)k1._24_4_ < n; k1._24_4_ = k1._24_4_ + 1) {
    InternalKey::InternalKey
              ((InternalKey *)&k2.field_0x18,&range[(int)k1._24_4_].start,0xffffffffffffff,
               kTypeValue);
    InternalKey::InternalKey
              ((InternalKey *)&start,&range[(int)k1._24_4_].limit,0xffffffffffffff,kTypeValue);
    uVar1 = VersionSet::ApproximateOffsetOf(this->versions_,this_00,(InternalKey *)&k2.field_0x18);
    uVar2 = VersionSet::ApproximateOffsetOf(this->versions_,this_00,(InternalKey *)&start);
    if (uVar2 < uVar1) {
      local_c0 = 0;
    }
    else {
      local_c0 = uVar2 - uVar1;
    }
    *(long *)((long)&((l.mu_)->mu_).super___mutex_base._M_mutex + (long)(int)k1._24_4_ * 8) =
         local_c0;
    InternalKey::~InternalKey((InternalKey *)&start);
    InternalKey::~InternalKey((InternalKey *)&k2.field_0x18);
  }
  Version::Unref(this_00);
  MutexLock::~MutexLock((MutexLock *)&v);
  return;
}

Assistant:

void DBImpl::GetApproximateSizes(const Range* range, int n, uint64_t* sizes) {
  // TODO(opt): better implementation
  MutexLock l(&mutex_);
  Version* v = versions_->current();
  v->Ref();

  for (int i = 0; i < n; i++) {
    // Convert user_key into a corresponding internal key.
    InternalKey k1(range[i].start, kMaxSequenceNumber, kValueTypeForSeek);
    InternalKey k2(range[i].limit, kMaxSequenceNumber, kValueTypeForSeek);
    uint64_t start = versions_->ApproximateOffsetOf(v, k1);
    uint64_t limit = versions_->ApproximateOffsetOf(v, k2);
    sizes[i] = (limit >= start ? limit - start : 0);
  }

  v->Unref();
}